

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ulong uVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint uVar60;
  uint uVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  undefined1 (*pauVar67) [16];
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  Geometry *pGVar71;
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar95 [32];
  float fVar102;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar115 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar124;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  float fVar132;
  undefined1 auVar129 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar149;
  float fVar150;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar151 [16];
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar152 [32];
  float fVar154;
  float fVar156;
  float fVar160;
  float fVar162;
  float fVar164;
  undefined1 auVar153 [64];
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar169 [32];
  float fVar173;
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar183;
  undefined1 auVar170 [32];
  float fVar172;
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar171 [64];
  float fVar184;
  float fVar185;
  undefined1 auVar186 [32];
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [64];
  undefined1 auVar195 [64];
  float fVar196;
  undefined1 auVar197 [32];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar198 [64];
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar207 [64];
  undefined1 auVar220 [64];
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1468;
  int local_1454;
  RayHit *local_1450;
  undefined1 (*local_1448) [16];
  ulong local_1440;
  ulong local_1438;
  RTCFilterFunctionNArguments local_1430;
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  float local_1390;
  undefined4 local_138c;
  undefined4 local_1388;
  float local_1384;
  float local_1380;
  uint local_137c;
  undefined4 local_1378;
  uint local_1374;
  uint local_1370;
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1330 [16];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [12];
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 (**local_1160) [16];
  undefined1 local_1140 [32];
  float local_1120 [4];
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar62 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    auVar145 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar89 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar93._8_4_ = 0x7fffffff;
    auVar93._0_8_ = 0x7fffffff7fffffff;
    auVar93._12_4_ = 0x7fffffff;
    auVar93 = vandps_avx((undefined1  [16])aVar3,auVar93);
    auVar94._8_4_ = 0x219392ef;
    auVar94._0_8_ = 0x219392ef219392ef;
    auVar94._12_4_ = 0x219392ef;
    auVar93 = vcmpps_avx(auVar93,auVar94,1);
    auVar125._8_4_ = 0x3f800000;
    auVar125._0_8_ = 0x3f8000003f800000;
    auVar125._12_4_ = 0x3f800000;
    auVar94 = vdivps_avx(auVar125,(undefined1  [16])aVar3);
    auVar126._8_4_ = 0x5d5e0b6b;
    auVar126._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar126._12_4_ = 0x5d5e0b6b;
    auVar93 = vblendvps_avx(auVar94,auVar126,auVar93);
    auVar115._0_4_ = auVar93._0_4_ * 0.99999964;
    auVar115._4_4_ = auVar93._4_4_ * 0.99999964;
    auVar115._8_4_ = auVar93._8_4_ * 0.99999964;
    auVar115._12_4_ = auVar93._12_4_ * 0.99999964;
    auVar151._0_4_ = auVar93._0_4_ * 1.0000004;
    auVar151._4_4_ = auVar93._4_4_ * 1.0000004;
    auVar151._8_4_ = auVar93._8_4_ * 1.0000004;
    auVar151._12_4_ = auVar93._12_4_ * 1.0000004;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_11f0._4_4_ = uVar1;
    local_11f0._0_4_ = uVar1;
    local_11f0._8_4_ = uVar1;
    local_11f0._12_4_ = uVar1;
    auVar144 = ZEXT1664(local_11f0);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1200._4_4_ = uVar1;
    local_1200._0_4_ = uVar1;
    local_1200._8_4_ = uVar1;
    local_1200._12_4_ = uVar1;
    auVar148 = ZEXT1664(local_1200);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1210._4_4_ = uVar1;
    local_1210._0_4_ = uVar1;
    local_1210._8_4_ = uVar1;
    local_1210._12_4_ = uVar1;
    auVar153 = ZEXT1664(local_1210);
    local_1220 = vshufps_avx(auVar115,auVar115,0);
    auVar171 = ZEXT1664(local_1220);
    auVar93 = vmovshdup_avx(auVar115);
    local_1230 = vshufps_avx(auVar115,auVar115,0x55);
    auVar187 = ZEXT1664(local_1230);
    auVar94 = vshufpd_avx(auVar115,auVar115,1);
    local_1240 = vshufps_avx(auVar115,auVar115,0xaa);
    auVar195 = ZEXT1664(local_1240);
    local_1250 = vshufps_avx(auVar151,auVar151,0);
    auVar198 = ZEXT1664(local_1250);
    local_1260 = vshufps_avx(auVar151,auVar151,0x55);
    auVar207 = ZEXT1664(local_1260);
    uVar69 = (ulong)(auVar115._0_4_ < 0.0) * 0x10;
    local_1270 = vshufps_avx(auVar151,auVar151,0xaa);
    auVar220 = ZEXT1664(local_1270);
    uVar68 = (ulong)(auVar93._0_4_ < 0.0) << 4 | 0x20;
    uVar65 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x40;
    local_1330 = vshufps_avx(auVar145,auVar145,0);
    auVar138 = ZEXT1664(local_1330);
    local_11e0 = mm_lookupmask_pd._0_8_;
    uStack_11d8 = mm_lookupmask_pd._8_8_;
    uStack_11d0 = mm_lookupmask_pd._0_8_;
    uStack_11c8 = mm_lookupmask_pd._8_8_;
    auVar93 = vshufps_avx(auVar89,auVar89,0);
    auVar77 = ZEXT1664(auVar93);
    local_1468 = 0;
    local_1450 = ray;
LAB_011e6547:
    do {
      pauVar67 = pauVar62 + -1;
      pauVar62 = pauVar62 + -1;
      if (*(float *)(*pauVar67 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar70 = *(ulong *)*pauVar62;
        while ((uVar70 & 8) == 0) {
          auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + uVar69),auVar144._0_16_);
          auVar145._0_4_ = auVar171._0_4_ * auVar93._0_4_;
          auVar145._4_4_ = auVar171._4_4_ * auVar93._4_4_;
          auVar145._8_4_ = auVar171._8_4_ * auVar93._8_4_;
          auVar145._12_4_ = auVar171._12_4_ * auVar93._12_4_;
          auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + uVar68),auVar148._0_16_);
          auVar89._0_4_ = auVar187._0_4_ * auVar93._0_4_;
          auVar89._4_4_ = auVar187._4_4_ * auVar93._4_4_;
          auVar89._8_4_ = auVar187._8_4_ * auVar93._8_4_;
          auVar89._12_4_ = auVar187._12_4_ * auVar93._12_4_;
          auVar93 = vmaxps_avx(auVar145,auVar89);
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + uVar65),auVar153._0_16_);
          auVar90._0_4_ = auVar195._0_4_ * auVar94._0_4_;
          auVar90._4_4_ = auVar195._4_4_ * auVar94._4_4_;
          auVar90._8_4_ = auVar195._8_4_ * auVar94._8_4_;
          auVar90._12_4_ = auVar195._12_4_ * auVar94._12_4_;
          auVar94 = vmaxps_avx(auVar90,auVar138._0_16_);
          _local_11c0 = vmaxps_avx(auVar93,auVar94);
          auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + (uVar69 ^ 0x10)),
                               auVar144._0_16_);
          auVar91._0_4_ = auVar198._0_4_ * auVar93._0_4_;
          auVar91._4_4_ = auVar198._4_4_ * auVar93._4_4_;
          auVar91._8_4_ = auVar198._8_4_ * auVar93._8_4_;
          auVar91._12_4_ = auVar198._12_4_ * auVar93._12_4_;
          auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + (uVar68 ^ 0x10)),
                               auVar148._0_16_);
          auVar103._0_4_ = auVar207._0_4_ * auVar93._0_4_;
          auVar103._4_4_ = auVar207._4_4_ * auVar93._4_4_;
          auVar103._8_4_ = auVar207._8_4_ * auVar93._8_4_;
          auVar103._12_4_ = auVar207._12_4_ * auVar93._12_4_;
          auVar93 = vminps_avx(auVar91,auVar103);
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + (uVar65 ^ 0x10)),
                               auVar153._0_16_);
          auVar104._0_4_ = auVar220._0_4_ * auVar94._0_4_;
          auVar104._4_4_ = auVar220._4_4_ * auVar94._4_4_;
          auVar104._8_4_ = auVar220._8_4_ * auVar94._8_4_;
          auVar104._12_4_ = auVar220._12_4_ * auVar94._12_4_;
          auVar94 = vminps_avx(auVar104,auVar77._0_16_);
          auVar93 = vminps_avx(auVar93,auVar94);
          auVar93 = vcmpps_avx(_local_11c0,auVar93,2);
          uVar64 = vmovmskps_avx(auVar93);
          if (uVar64 == 0) {
            if (pauVar62 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_011e6547;
          }
          uVar64 = uVar64 & 0xff;
          uVar63 = uVar70 & 0xfffffffffffffff0;
          lVar6 = 0;
          if (uVar64 != 0) {
            for (; (uVar64 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar70 = *(ulong *)(uVar63 + lVar6 * 8);
          uVar64 = uVar64 - 1 & uVar64;
          if (uVar64 != 0) {
            uVar60 = *(uint *)(local_11c0 + lVar6 * 4);
            lVar6 = 0;
            if (uVar64 != 0) {
              for (; (uVar64 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar4 = *(ulong *)(uVar63 + lVar6 * 8);
            uVar61 = *(uint *)(local_11c0 + lVar6 * 4);
            uVar64 = uVar64 - 1 & uVar64;
            if (uVar64 == 0) {
              if (uVar60 < uVar61) {
                *(ulong *)*pauVar62 = uVar4;
                *(uint *)(*pauVar62 + 8) = uVar61;
                pauVar62 = pauVar62 + 1;
              }
              else {
                *(ulong *)*pauVar62 = uVar70;
                *(uint *)(*pauVar62 + 8) = uVar60;
                pauVar62 = pauVar62 + 1;
                uVar70 = uVar4;
              }
            }
            else {
              auVar84._8_8_ = 0;
              auVar84._0_8_ = uVar70;
              auVar93 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar60));
              auVar92._8_8_ = 0;
              auVar92._0_8_ = uVar4;
              auVar94 = vpunpcklqdq_avx(auVar92,ZEXT416(uVar61));
              lVar6 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              auVar105._8_8_ = 0;
              auVar105._0_8_ = *(ulong *)(uVar63 + lVar6 * 8);
              auVar89 = vpunpcklqdq_avx(auVar105,ZEXT416(*(uint *)(local_11c0 + lVar6 * 4)));
              auVar145 = vpcmpgtd_avx(auVar94,auVar93);
              uVar64 = uVar64 - 1 & uVar64;
              if (uVar64 == 0) {
                auVar151 = vpshufd_avx(auVar145,0xaa);
                auVar145 = vblendvps_avx(auVar94,auVar93,auVar151);
                auVar93 = vblendvps_avx(auVar93,auVar94,auVar151);
                auVar94 = vpcmpgtd_avx(auVar89,auVar145);
                auVar151 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar89,auVar145,auVar151);
                auVar145 = vblendvps_avx(auVar145,auVar89,auVar151);
                auVar89 = vpcmpgtd_avx(auVar145,auVar93);
                auVar151 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar145,auVar93,auVar151);
                auVar93 = vblendvps_avx(auVar93,auVar145,auVar151);
                *pauVar62 = auVar93;
                pauVar62[1] = auVar89;
                uVar70 = auVar94._0_8_;
                pauVar62 = pauVar62 + 2;
              }
              else {
                lVar6 = 0;
                if (uVar64 != 0) {
                  for (; (uVar64 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                auVar127._8_8_ = 0;
                auVar127._0_8_ = *(ulong *)(uVar63 + lVar6 * 8);
                auVar115 = vpunpcklqdq_avx(auVar127,ZEXT416(*(uint *)(local_11c0 + lVar6 * 4)));
                auVar151 = vpshufd_avx(auVar145,0xaa);
                auVar145 = vblendvps_avx(auVar94,auVar93,auVar151);
                auVar93 = vblendvps_avx(auVar93,auVar94,auVar151);
                auVar94 = vpcmpgtd_avx(auVar115,auVar89);
                auVar151 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar115,auVar89,auVar151);
                auVar89 = vblendvps_avx(auVar89,auVar115,auVar151);
                auVar151 = vpcmpgtd_avx(auVar89,auVar93);
                auVar115 = vpshufd_avx(auVar151,0xaa);
                auVar151 = vblendvps_avx(auVar89,auVar93,auVar115);
                auVar93 = vblendvps_avx(auVar93,auVar89,auVar115);
                auVar89 = vpcmpgtd_avx(auVar94,auVar145);
                auVar115 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar94,auVar145,auVar115);
                auVar94 = vblendvps_avx(auVar145,auVar94,auVar115);
                auVar145 = vpcmpgtd_avx(auVar151,auVar94);
                auVar115 = vpshufd_avx(auVar145,0xaa);
                auVar145 = vblendvps_avx(auVar151,auVar94,auVar115);
                auVar94 = vblendvps_avx(auVar94,auVar151,auVar115);
                *pauVar62 = auVar93;
                pauVar62[1] = auVar94;
                pauVar62[2] = auVar145;
                auVar138 = ZEXT1664(local_1330);
                uVar70 = auVar89._0_8_;
                pauVar62 = pauVar62 + 3;
              }
            }
          }
        }
        if (((uint)uVar70 & 0xf) == 8) {
          uVar64 = *(uint *)(local_1468 + 0xc);
          local_1440 = (ulong)uVar64;
          uVar60 = *(uint *)(local_1468 + 0x10);
          local_1438 = (ulong)uVar60;
          lVar66 = *(uint *)(local_1468 + 0x24) + local_1468;
          uVar70 = uVar70 >> 4;
          lVar6 = lVar66 + uVar70 * 4;
          auVar93 = *(undefined1 (*) [16])(lVar6 + 0x2c + local_1440 * 4);
          auVar94 = auVar93;
          if (2 < local_1438) {
            auVar94 = *(undefined1 (*) [16])(lVar66 + uVar70 * 4 + 0x2c + local_1440 * 8);
          }
          auVar145 = *(undefined1 (*) [16])(lVar66 + 0x2c + uVar70 * 4);
          if (local_1440 == 2) {
            auVar145 = vshufps_avx(auVar145,auVar145,0x54);
            auVar93 = vshufps_avx(auVar93,auVar93,0x54);
            auVar94 = vshufps_avx(auVar94,auVar94,0x54);
          }
          uVar70 = (ulong)*(uint *)(local_1468 + 0x14);
          pauVar67 = (undefined1 (*) [16])(lVar6 + uVar70 * 4 + 0x2c);
          auVar89 = *(undefined1 (*) [16])(*pauVar67 + local_1440 * 4);
          auVar151 = auVar89;
          if (2 < uVar60) {
            auVar151 = *(undefined1 (*) [16])(*pauVar67 + local_1440 * 8);
          }
          auVar115 = *pauVar67;
          if (uVar64 == 2) {
            auVar115 = vshufps_avx(auVar115,auVar115,0x54);
            auVar89 = vshufps_avx(auVar89,auVar89,0x54);
            auVar151 = vshufps_avx(auVar151,auVar151,0x54);
          }
          pauVar67 = (undefined1 (*) [16])(lVar6 + uVar70 * 8 + 0x2c);
          auVar125 = *(undefined1 (*) [16])(*pauVar67 + local_1440 * 4);
          auVar126 = auVar125;
          if (2 < uVar60) {
            auVar126 = *(undefined1 (*) [16])(*pauVar67 + local_1440 * 8);
          }
          auVar146._16_16_ = auVar93;
          auVar146._0_16_ = auVar145;
          auVar73._16_16_ = auVar94;
          auVar73._0_16_ = auVar93;
          auVar26 = vunpcklps_avx(auVar146,auVar73);
          auVar146 = vshufps_avx(auVar146,auVar146,0xa5);
          auVar73 = vshufps_avx(auVar73,auVar73,0x94);
          auVar139._16_16_ = auVar89;
          auVar139._0_16_ = auVar115;
          auVar116._16_16_ = auVar151;
          auVar116._0_16_ = auVar89;
          auVar27 = vunpcklps_avx(auVar139,auVar116);
          auVar139 = vshufps_avx(auVar139,auVar139,0xa5);
          auVar116 = vshufps_avx(auVar116,auVar116,0x94);
          auVar93 = *pauVar67;
          if (uVar64 == 2) {
            auVar93 = vshufps_avx(auVar93,auVar93,0x54);
            auVar125 = vshufps_avx(auVar125,auVar125,0x54);
            auVar126 = vshufps_avx(auVar126,auVar126,0x54);
          }
          auVar117._16_16_ = auVar125;
          auVar117._0_16_ = auVar93;
          auVar128._16_16_ = auVar126;
          auVar128._0_16_ = auVar125;
          auVar28 = vunpcklps_avx(auVar117,auVar128);
          auVar23 = vshufps_avx(auVar117,auVar117,0xa5);
          uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar169._4_4_ = uVar1;
          auVar169._0_4_ = uVar1;
          auVar169._8_4_ = uVar1;
          auVar169._12_4_ = uVar1;
          auVar169._16_4_ = uVar1;
          auVar169._20_4_ = uVar1;
          auVar169._24_4_ = uVar1;
          auVar169._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar186._4_4_ = uVar1;
          auVar186._0_4_ = uVar1;
          auVar186._8_4_ = uVar1;
          auVar186._12_4_ = uVar1;
          auVar186._16_4_ = uVar1;
          auVar186._20_4_ = uVar1;
          auVar186._24_4_ = uVar1;
          auVar186._28_4_ = uVar1;
          auVar24 = vshufps_avx(auVar128,auVar128,0x94);
          uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar197._4_4_ = uVar2;
          auVar197._0_4_ = uVar2;
          auVar197._8_4_ = uVar2;
          auVar197._12_4_ = uVar2;
          auVar197._16_4_ = uVar2;
          auVar197._20_4_ = uVar2;
          auVar197._24_4_ = uVar2;
          auVar197._28_4_ = uVar2;
          local_12c0 = vsubps_avx(auVar26,auVar169);
          local_12e0 = vsubps_avx(auVar27,auVar186);
          local_1300 = vsubps_avx(auVar28,auVar197);
          auVar146 = vsubps_avx(auVar146,auVar169);
          auVar139 = vsubps_avx(auVar139,auVar186);
          auVar26 = vsubps_avx(auVar23,auVar197);
          auVar73 = vsubps_avx(auVar73,auVar169);
          auVar116 = vsubps_avx(auVar116,auVar186);
          auVar27 = vsubps_avx(auVar24,auVar197);
          local_1320 = vsubps_avx(auVar73,local_12c0);
          local_fc0 = vsubps_avx(auVar116,local_12e0);
          local_fe0 = vsubps_avx(auVar27,local_1300);
          fVar7 = local_12e0._0_4_;
          fVar72 = auVar116._0_4_ + fVar7;
          fVar10 = local_12e0._4_4_;
          fVar78 = auVar116._4_4_ + fVar10;
          fVar96 = local_12e0._8_4_;
          fVar79 = auVar116._8_4_ + fVar96;
          fVar99 = local_12e0._12_4_;
          fVar80 = auVar116._12_4_ + fVar99;
          fVar14 = local_12e0._16_4_;
          fVar81 = auVar116._16_4_ + fVar14;
          fVar17 = local_12e0._20_4_;
          fVar82 = auVar116._20_4_ + fVar17;
          fVar20 = local_12e0._24_4_;
          fVar83 = auVar116._24_4_ + fVar20;
          fVar8 = local_1300._0_4_;
          fVar149 = auVar27._0_4_ + fVar8;
          fVar11 = local_1300._4_4_;
          fVar154 = auVar27._4_4_ + fVar11;
          fVar97 = local_1300._8_4_;
          fVar156 = auVar27._8_4_ + fVar97;
          fVar101 = local_1300._12_4_;
          fVar158 = auVar27._12_4_ + fVar101;
          fVar15 = local_1300._16_4_;
          fVar160 = auVar27._16_4_ + fVar15;
          fVar18 = local_1300._20_4_;
          fVar162 = auVar27._20_4_ + fVar18;
          fVar21 = local_1300._24_4_;
          fVar164 = auVar27._24_4_ + fVar21;
          fVar167 = local_1300._28_4_;
          fVar124 = local_fe0._0_4_;
          fVar130 = local_fe0._4_4_;
          auVar23._4_4_ = fVar130 * fVar78;
          auVar23._0_4_ = fVar124 * fVar72;
          fVar131 = local_fe0._8_4_;
          auVar23._8_4_ = fVar131 * fVar79;
          fVar132 = local_fe0._12_4_;
          auVar23._12_4_ = fVar132 * fVar80;
          fVar133 = local_fe0._16_4_;
          auVar23._16_4_ = fVar133 * fVar81;
          fVar134 = local_fe0._20_4_;
          auVar23._20_4_ = fVar134 * fVar82;
          fVar135 = local_fe0._24_4_;
          auVar23._24_4_ = fVar135 * fVar83;
          auVar23._28_4_ = uVar1;
          fVar205 = local_fc0._0_4_;
          fVar208 = local_fc0._4_4_;
          auVar28._4_4_ = fVar208 * fVar154;
          auVar28._0_4_ = fVar205 * fVar149;
          fVar210 = local_fc0._8_4_;
          auVar28._8_4_ = fVar210 * fVar156;
          fVar212 = local_fc0._12_4_;
          auVar28._12_4_ = fVar212 * fVar158;
          fVar214 = local_fc0._16_4_;
          auVar28._16_4_ = fVar214 * fVar160;
          fVar216 = local_fc0._20_4_;
          auVar28._20_4_ = fVar216 * fVar162;
          fVar218 = local_fc0._24_4_;
          auVar28._24_4_ = fVar218 * fVar164;
          auVar28._28_4_ = auVar24._28_4_;
          auVar23 = vsubps_avx(auVar28,auVar23);
          fVar9 = local_12c0._0_4_;
          fVar184 = auVar73._0_4_ + fVar9;
          fVar12 = local_12c0._4_4_;
          fVar188 = auVar73._4_4_ + fVar12;
          fVar98 = local_12c0._8_4_;
          fVar190 = auVar73._8_4_ + fVar98;
          fVar13 = local_12c0._12_4_;
          fVar191 = auVar73._12_4_ + fVar13;
          fVar16 = local_12c0._16_4_;
          fVar192 = auVar73._16_4_ + fVar16;
          fVar19 = local_12c0._20_4_;
          fVar193 = auVar73._20_4_ + fVar19;
          fVar22 = local_12c0._24_4_;
          fVar194 = auVar73._24_4_ + fVar22;
          fVar166 = local_1320._0_4_;
          fVar172 = local_1320._4_4_;
          auVar25._4_4_ = fVar172 * fVar154;
          auVar25._0_4_ = fVar166 * fVar149;
          fVar174 = local_1320._8_4_;
          auVar25._8_4_ = fVar174 * fVar156;
          fVar176 = local_1320._12_4_;
          auVar25._12_4_ = fVar176 * fVar158;
          fVar178 = local_1320._16_4_;
          auVar25._16_4_ = fVar178 * fVar160;
          fVar180 = local_1320._20_4_;
          auVar25._20_4_ = fVar180 * fVar162;
          fVar182 = local_1320._24_4_;
          auVar25._24_4_ = fVar182 * fVar164;
          auVar25._28_4_ = auVar27._28_4_ + fVar167;
          auVar29._4_4_ = fVar188 * fVar130;
          auVar29._0_4_ = fVar184 * fVar124;
          auVar29._8_4_ = fVar190 * fVar131;
          auVar29._12_4_ = fVar191 * fVar132;
          auVar29._16_4_ = fVar192 * fVar133;
          auVar29._20_4_ = fVar193 * fVar134;
          auVar29._24_4_ = fVar194 * fVar135;
          auVar29._28_4_ = auVar24._28_4_;
          auVar24 = vsubps_avx(auVar29,auVar25);
          auVar30._4_4_ = fVar208 * fVar188;
          auVar30._0_4_ = fVar205 * fVar184;
          auVar30._8_4_ = fVar210 * fVar190;
          auVar30._12_4_ = fVar212 * fVar191;
          auVar30._16_4_ = fVar214 * fVar192;
          auVar30._20_4_ = fVar216 * fVar193;
          auVar30._24_4_ = fVar218 * fVar194;
          auVar30._28_4_ = auVar73._28_4_ + local_12c0._28_4_;
          auVar31._4_4_ = fVar172 * fVar78;
          auVar31._0_4_ = fVar166 * fVar72;
          auVar31._8_4_ = fVar174 * fVar79;
          auVar31._12_4_ = fVar176 * fVar80;
          auVar31._16_4_ = fVar178 * fVar81;
          auVar31._20_4_ = fVar180 * fVar82;
          auVar31._24_4_ = fVar182 * fVar83;
          auVar31._28_4_ = auVar116._28_4_ + local_12e0._28_4_;
          fVar72 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_13e0._4_4_ = fVar72;
          local_13e0._0_4_ = fVar72;
          local_13e0._8_4_ = fVar72;
          local_13e0._12_4_ = fVar72;
          local_13e0._16_4_ = fVar72;
          local_13e0._20_4_ = fVar72;
          local_13e0._24_4_ = fVar72;
          local_13e0._28_4_ = fVar72;
          auVar28 = vsubps_avx(auVar31,auVar30);
          local_1400._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_1360._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar185 = (float)local_1360._4_4_ * auVar23._0_4_ +
                    (float)local_1400._4_4_ * auVar24._0_4_ + fVar72 * auVar28._0_4_;
          fVar189 = (float)local_1360._4_4_ * auVar23._4_4_ +
                    (float)local_1400._4_4_ * auVar24._4_4_ + fVar72 * auVar28._4_4_;
          local_13c0._0_8_ = CONCAT44(fVar189,fVar185);
          local_13c0._8_4_ =
               (float)local_1360._4_4_ * auVar23._8_4_ +
               (float)local_1400._4_4_ * auVar24._8_4_ + fVar72 * auVar28._8_4_;
          local_13c0._12_4_ =
               (float)local_1360._4_4_ * auVar23._12_4_ +
               (float)local_1400._4_4_ * auVar24._12_4_ + fVar72 * auVar28._12_4_;
          local_13c0._16_4_ =
               (float)local_1360._4_4_ * auVar23._16_4_ +
               (float)local_1400._4_4_ * auVar24._16_4_ + fVar72 * auVar28._16_4_;
          local_13c0._20_4_ =
               (float)local_1360._4_4_ * auVar23._20_4_ +
               (float)local_1400._4_4_ * auVar24._20_4_ + fVar72 * auVar28._20_4_;
          local_13c0._24_4_ =
               (float)local_1360._4_4_ * auVar23._24_4_ +
               (float)local_1400._4_4_ * auVar24._24_4_ + fVar72 * auVar28._24_4_;
          local_13c0._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar28._28_4_;
          local_1000 = vsubps_avx(local_12e0,auVar139);
          local_1020 = vsubps_avx(local_1300,auVar26);
          fVar80 = fVar7 + auVar139._0_4_;
          fVar81 = fVar10 + auVar139._4_4_;
          fVar82 = fVar96 + auVar139._8_4_;
          fVar83 = fVar99 + auVar139._12_4_;
          fVar149 = fVar14 + auVar139._16_4_;
          fVar154 = fVar17 + auVar139._20_4_;
          fVar156 = fVar20 + auVar139._24_4_;
          fVar78 = auVar139._28_4_;
          fVar158 = fVar8 + auVar26._0_4_;
          fVar160 = fVar11 + auVar26._4_4_;
          fVar162 = fVar97 + auVar26._8_4_;
          fVar164 = fVar101 + auVar26._12_4_;
          fVar184 = fVar15 + auVar26._16_4_;
          fVar188 = fVar18 + auVar26._20_4_;
          fVar190 = fVar21 + auVar26._24_4_;
          fVar79 = auVar26._28_4_;
          fVar150 = local_1020._0_4_;
          fVar155 = local_1020._4_4_;
          auVar24._4_4_ = fVar155 * fVar81;
          auVar24._0_4_ = fVar150 * fVar80;
          fVar157 = local_1020._8_4_;
          auVar24._8_4_ = fVar157 * fVar82;
          fVar159 = local_1020._12_4_;
          auVar24._12_4_ = fVar159 * fVar83;
          fVar161 = local_1020._16_4_;
          auVar24._16_4_ = fVar161 * fVar149;
          fVar163 = local_1020._20_4_;
          auVar24._20_4_ = fVar163 * fVar154;
          fVar165 = local_1020._24_4_;
          auVar24._24_4_ = fVar165 * fVar156;
          auVar24._28_4_ = local_fc0._28_4_;
          fVar196 = local_1000._0_4_;
          fVar199 = local_1000._4_4_;
          auVar32._4_4_ = fVar199 * fVar160;
          auVar32._0_4_ = fVar196 * fVar158;
          fVar200 = local_1000._8_4_;
          auVar32._8_4_ = fVar200 * fVar162;
          fVar201 = local_1000._12_4_;
          auVar32._12_4_ = fVar201 * fVar164;
          fVar202 = local_1000._16_4_;
          auVar32._16_4_ = fVar202 * fVar184;
          fVar203 = local_1000._20_4_;
          auVar32._20_4_ = fVar203 * fVar188;
          fVar204 = local_1000._24_4_;
          auVar32._24_4_ = fVar204 * fVar190;
          auVar32._28_4_ = fVar167;
          auVar23 = vsubps_avx(auVar32,auVar24);
          auVar24 = vsubps_avx(local_12c0,auVar146);
          fVar206 = auVar24._0_4_;
          fVar209 = auVar24._4_4_;
          auVar33._4_4_ = fVar209 * fVar160;
          auVar33._0_4_ = fVar206 * fVar158;
          fVar211 = auVar24._8_4_;
          auVar33._8_4_ = fVar211 * fVar162;
          fVar213 = auVar24._12_4_;
          auVar33._12_4_ = fVar213 * fVar164;
          fVar215 = auVar24._16_4_;
          auVar33._16_4_ = fVar215 * fVar184;
          fVar217 = auVar24._20_4_;
          auVar33._20_4_ = fVar217 * fVar188;
          fVar219 = auVar24._24_4_;
          auVar33._24_4_ = fVar219 * fVar190;
          auVar33._28_4_ = fVar167 + fVar79;
          fVar167 = fVar9 + auVar146._0_4_;
          fVar158 = fVar12 + auVar146._4_4_;
          fVar160 = fVar98 + auVar146._8_4_;
          fVar162 = fVar13 + auVar146._12_4_;
          fVar164 = fVar16 + auVar146._16_4_;
          fVar184 = fVar19 + auVar146._20_4_;
          fVar188 = fVar22 + auVar146._24_4_;
          auVar34._4_4_ = fVar155 * fVar158;
          auVar34._0_4_ = fVar150 * fVar167;
          auVar34._8_4_ = fVar157 * fVar160;
          auVar34._12_4_ = fVar159 * fVar162;
          auVar34._16_4_ = fVar161 * fVar164;
          auVar34._20_4_ = fVar163 * fVar184;
          auVar34._24_4_ = fVar165 * fVar188;
          auVar34._28_4_ = local_1020._28_4_;
          auVar24 = vsubps_avx(auVar34,auVar33);
          auVar35._4_4_ = fVar199 * fVar158;
          auVar35._0_4_ = fVar196 * fVar167;
          auVar35._8_4_ = fVar200 * fVar160;
          auVar35._12_4_ = fVar201 * fVar162;
          auVar35._16_4_ = fVar202 * fVar164;
          auVar35._20_4_ = fVar203 * fVar184;
          auVar35._24_4_ = fVar204 * fVar188;
          auVar35._28_4_ = local_1020._28_4_;
          auVar36._4_4_ = fVar209 * fVar81;
          auVar36._0_4_ = fVar206 * fVar80;
          auVar36._8_4_ = fVar211 * fVar82;
          auVar36._12_4_ = fVar213 * fVar83;
          auVar36._16_4_ = fVar215 * fVar149;
          auVar36._20_4_ = fVar217 * fVar154;
          auVar36._24_4_ = fVar219 * fVar156;
          auVar36._28_4_ = local_12e0._28_4_ + fVar78;
          auVar28 = vsubps_avx(auVar36,auVar35);
          local_11a0._0_4_ =
               (float)local_1360._4_4_ * auVar23._0_4_ +
               (float)local_1400._4_4_ * auVar24._0_4_ + fVar72 * auVar28._0_4_;
          local_11a0._4_4_ =
               (float)local_1360._4_4_ * auVar23._4_4_ +
               (float)local_1400._4_4_ * auVar24._4_4_ + fVar72 * auVar28._4_4_;
          local_11a0._8_4_ =
               (float)local_1360._4_4_ * auVar23._8_4_ +
               (float)local_1400._4_4_ * auVar24._8_4_ + fVar72 * auVar28._8_4_;
          local_11a0._12_4_ =
               (float)local_1360._4_4_ * auVar23._12_4_ +
               (float)local_1400._4_4_ * auVar24._12_4_ + fVar72 * auVar28._12_4_;
          local_11a0._16_4_ =
               (float)local_1360._4_4_ * auVar23._16_4_ +
               (float)local_1400._4_4_ * auVar24._16_4_ + fVar72 * auVar28._16_4_;
          local_11a0._20_4_ =
               (float)local_1360._4_4_ * auVar23._20_4_ +
               (float)local_1400._4_4_ * auVar24._20_4_ + fVar72 * auVar28._20_4_;
          local_11a0._24_4_ =
               (float)local_1360._4_4_ * auVar23._24_4_ +
               (float)local_1400._4_4_ * auVar24._24_4_ + fVar72 * auVar28._24_4_;
          local_11a0._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar28._28_4_;
          auVar23 = vsubps_avx(auVar146,auVar73);
          fVar188 = auVar73._0_4_ + auVar146._0_4_;
          fVar190 = auVar73._4_4_ + auVar146._4_4_;
          fVar191 = auVar73._8_4_ + auVar146._8_4_;
          fVar192 = auVar73._12_4_ + auVar146._12_4_;
          fVar193 = auVar73._16_4_ + auVar146._16_4_;
          fVar194 = auVar73._20_4_ + auVar146._20_4_;
          fVar100 = auVar73._24_4_ + auVar146._24_4_;
          auVar24 = vsubps_avx(auVar139,auVar116);
          fVar102 = auVar139._0_4_ + auVar116._0_4_;
          fVar108 = auVar139._4_4_ + auVar116._4_4_;
          fVar109 = auVar139._8_4_ + auVar116._8_4_;
          fVar110 = auVar139._12_4_ + auVar116._12_4_;
          fVar111 = auVar139._16_4_ + auVar116._16_4_;
          fVar112 = auVar139._20_4_ + auVar116._20_4_;
          fVar113 = auVar139._24_4_ + auVar116._24_4_;
          fVar114 = fVar78 + auVar116._28_4_;
          auVar116 = vsubps_avx(auVar26,auVar27);
          fVar80 = auVar26._0_4_ + auVar27._0_4_;
          fVar81 = auVar26._4_4_ + auVar27._4_4_;
          fVar82 = auVar26._8_4_ + auVar27._8_4_;
          fVar83 = auVar26._12_4_ + auVar27._12_4_;
          fVar149 = auVar26._16_4_ + auVar27._16_4_;
          fVar122 = auVar26._20_4_ + auVar27._20_4_;
          fVar123 = auVar26._24_4_ + auVar27._24_4_;
          fVar154 = auVar116._0_4_;
          fVar156 = auVar116._4_4_;
          auVar37._4_4_ = fVar156 * fVar108;
          auVar37._0_4_ = fVar154 * fVar102;
          fVar158 = auVar116._8_4_;
          auVar37._8_4_ = fVar158 * fVar109;
          fVar160 = auVar116._12_4_;
          auVar37._12_4_ = fVar160 * fVar110;
          fVar162 = auVar116._16_4_;
          auVar37._16_4_ = fVar162 * fVar111;
          fVar164 = auVar116._20_4_;
          auVar37._20_4_ = fVar164 * fVar112;
          fVar184 = auVar116._24_4_;
          auVar37._24_4_ = fVar184 * fVar113;
          auVar37._28_4_ = fVar78;
          fVar168 = auVar24._0_4_;
          fVar173 = auVar24._4_4_;
          auVar38._4_4_ = fVar173 * fVar81;
          auVar38._0_4_ = fVar168 * fVar80;
          fVar175 = auVar24._8_4_;
          auVar38._8_4_ = fVar175 * fVar82;
          fVar177 = auVar24._12_4_;
          auVar38._12_4_ = fVar177 * fVar83;
          fVar179 = auVar24._16_4_;
          auVar38._16_4_ = fVar179 * fVar149;
          fVar181 = auVar24._20_4_;
          auVar38._20_4_ = fVar181 * fVar122;
          fVar183 = auVar24._24_4_;
          auVar38._24_4_ = fVar183 * fVar123;
          auVar38._28_4_ = fVar79;
          auVar139 = vsubps_avx(auVar38,auVar37);
          fVar167 = auVar23._0_4_;
          fVar78 = auVar23._4_4_;
          auVar39._4_4_ = fVar78 * fVar81;
          auVar39._0_4_ = fVar167 * fVar80;
          fVar80 = auVar23._8_4_;
          auVar39._8_4_ = fVar80 * fVar82;
          fVar81 = auVar23._12_4_;
          auVar39._12_4_ = fVar81 * fVar83;
          fVar82 = auVar23._16_4_;
          auVar39._16_4_ = fVar82 * fVar149;
          fVar83 = auVar23._20_4_;
          auVar39._20_4_ = fVar83 * fVar122;
          fVar149 = auVar23._24_4_;
          auVar39._24_4_ = fVar149 * fVar123;
          auVar39._28_4_ = fVar79 + auVar27._28_4_;
          auVar27._4_4_ = fVar156 * fVar190;
          auVar27._0_4_ = fVar154 * fVar188;
          auVar27._8_4_ = fVar158 * fVar191;
          auVar27._12_4_ = fVar160 * fVar192;
          auVar27._16_4_ = fVar162 * fVar193;
          auVar27._20_4_ = fVar164 * fVar194;
          auVar27._24_4_ = fVar184 * fVar100;
          auVar27._28_4_ = fVar79;
          auVar26 = vsubps_avx(auVar27,auVar39);
          auVar40._4_4_ = fVar173 * fVar190;
          auVar40._0_4_ = fVar168 * fVar188;
          auVar40._8_4_ = fVar175 * fVar191;
          auVar40._12_4_ = fVar177 * fVar192;
          auVar40._16_4_ = fVar179 * fVar193;
          auVar40._20_4_ = fVar181 * fVar194;
          auVar40._24_4_ = fVar183 * fVar100;
          auVar40._28_4_ = auVar73._28_4_ + auVar146._28_4_;
          auVar41._4_4_ = fVar78 * fVar108;
          auVar41._0_4_ = fVar167 * fVar102;
          auVar41._8_4_ = fVar80 * fVar109;
          auVar41._12_4_ = fVar81 * fVar110;
          auVar41._16_4_ = fVar82 * fVar111;
          auVar41._20_4_ = fVar83 * fVar112;
          auVar41._24_4_ = fVar149 * fVar113;
          auVar41._28_4_ = fVar114;
          auVar146 = vsubps_avx(auVar41,auVar40);
          local_1400._0_4_ = local_1400._4_4_;
          fStack_13f8 = (float)local_1400._4_4_;
          fStack_13f4 = (float)local_1400._4_4_;
          fStack_13f0 = (float)local_1400._4_4_;
          fStack_13ec = (float)local_1400._4_4_;
          fStack_13e8 = (float)local_1400._4_4_;
          fStack_13e4 = (float)local_1400._4_4_;
          local_1360._0_4_ = local_1360._4_4_;
          fStack_1358 = (float)local_1360._4_4_;
          fStack_1354 = (float)local_1360._4_4_;
          fStack_1350 = (float)local_1360._4_4_;
          fStack_134c = (float)local_1360._4_4_;
          fStack_1348 = (float)local_1360._4_4_;
          fStack_1344 = (float)local_1360._4_4_;
          auVar95._0_4_ =
               (float)local_1360._4_4_ * auVar139._0_4_ +
               (float)local_1400._4_4_ * auVar26._0_4_ + fVar72 * auVar146._0_4_;
          auVar95._4_4_ =
               (float)local_1360._4_4_ * auVar139._4_4_ +
               (float)local_1400._4_4_ * auVar26._4_4_ + fVar72 * auVar146._4_4_;
          auVar95._8_4_ =
               (float)local_1360._4_4_ * auVar139._8_4_ +
               (float)local_1400._4_4_ * auVar26._8_4_ + fVar72 * auVar146._8_4_;
          auVar95._12_4_ =
               (float)local_1360._4_4_ * auVar139._12_4_ +
               (float)local_1400._4_4_ * auVar26._12_4_ + fVar72 * auVar146._12_4_;
          auVar95._16_4_ =
               (float)local_1360._4_4_ * auVar139._16_4_ +
               (float)local_1400._4_4_ * auVar26._16_4_ + fVar72 * auVar146._16_4_;
          auVar95._20_4_ =
               (float)local_1360._4_4_ * auVar139._20_4_ +
               (float)local_1400._4_4_ * auVar26._20_4_ + fVar72 * auVar146._20_4_;
          auVar95._24_4_ =
               (float)local_1360._4_4_ * auVar139._24_4_ +
               (float)local_1400._4_4_ * auVar26._24_4_ + fVar72 * auVar146._24_4_;
          auVar95._28_4_ = fVar114 + fVar114 + auVar146._28_4_;
          local_1180._0_4_ = auVar95._0_4_ + fVar185 + local_11a0._0_4_;
          local_1180._4_4_ = auVar95._4_4_ + fVar189 + local_11a0._4_4_;
          local_1180._8_4_ = auVar95._8_4_ + local_13c0._8_4_ + local_11a0._8_4_;
          local_1180._12_4_ = auVar95._12_4_ + local_13c0._12_4_ + local_11a0._12_4_;
          local_1180._16_4_ = auVar95._16_4_ + local_13c0._16_4_ + local_11a0._16_4_;
          local_1180._20_4_ = auVar95._20_4_ + local_13c0._20_4_ + local_11a0._20_4_;
          local_1180._24_4_ = auVar95._24_4_ + local_13c0._24_4_ + local_11a0._24_4_;
          local_1180._28_4_ = auVar95._28_4_ + local_13c0._28_4_ + local_11a0._28_4_;
          auVar146 = vminps_avx(local_13c0,local_11a0);
          auVar146 = vminps_avx(auVar146,auVar95);
          auVar118._8_4_ = 0x7fffffff;
          auVar118._0_8_ = 0x7fffffff7fffffff;
          auVar118._12_4_ = 0x7fffffff;
          auVar118._16_4_ = 0x7fffffff;
          auVar118._20_4_ = 0x7fffffff;
          auVar118._24_4_ = 0x7fffffff;
          auVar118._28_4_ = 0x7fffffff;
          local_1060 = vandps_avx(local_1180,auVar118);
          fVar79 = local_1060._0_4_ * 1.1920929e-07;
          fVar188 = local_1060._4_4_ * 1.1920929e-07;
          auVar42._4_4_ = fVar188;
          auVar42._0_4_ = fVar79;
          fVar190 = local_1060._8_4_ * 1.1920929e-07;
          auVar42._8_4_ = fVar190;
          fVar191 = local_1060._12_4_ * 1.1920929e-07;
          auVar42._12_4_ = fVar191;
          fVar192 = local_1060._16_4_ * 1.1920929e-07;
          auVar42._16_4_ = fVar192;
          fVar193 = local_1060._20_4_ * 1.1920929e-07;
          auVar42._20_4_ = fVar193;
          fVar194 = local_1060._24_4_ * 1.1920929e-07;
          auVar42._24_4_ = fVar194;
          auVar42._28_4_ = 0x34000000;
          auVar136._0_8_ = CONCAT44(fVar188,fVar79) ^ 0x8000000080000000;
          auVar136._8_4_ = -fVar190;
          auVar136._12_4_ = -fVar191;
          auVar136._16_4_ = -fVar192;
          auVar136._20_4_ = -fVar193;
          auVar136._24_4_ = -fVar194;
          auVar136._28_4_ = 0xb4000000;
          auVar146 = vcmpps_avx(auVar146,auVar136,5);
          auVar139 = vmaxps_avx(local_13c0,local_11a0);
          auVar73 = vmaxps_avx(auVar139,auVar95);
          auVar73 = vcmpps_avx(auVar73,auVar42,2);
          local_1040 = vorps_avx(auVar146,auVar73);
          local_1448 = (undefined1 (*) [16])(lVar6 + 0x2c + uVar70 * 0xc);
          auVar26._8_8_ = uStack_11d8;
          auVar26._0_8_ = local_11e0;
          auVar26._16_8_ = uStack_11d0;
          auVar26._24_8_ = uStack_11c8;
          auVar26 = auVar26 & local_1040;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar43._4_4_ = fVar199 * fVar130;
            auVar43._0_4_ = fVar196 * fVar124;
            auVar43._8_4_ = fVar200 * fVar131;
            auVar43._12_4_ = fVar201 * fVar132;
            auVar43._16_4_ = fVar202 * fVar133;
            auVar43._20_4_ = fVar203 * fVar134;
            auVar43._24_4_ = fVar204 * fVar135;
            auVar43._28_4_ = local_1040._28_4_;
            auVar44._4_4_ = fVar208 * fVar155;
            auVar44._0_4_ = fVar205 * fVar150;
            auVar44._8_4_ = fVar210 * fVar157;
            auVar44._12_4_ = fVar212 * fVar159;
            auVar44._16_4_ = fVar214 * fVar161;
            auVar44._20_4_ = fVar216 * fVar163;
            auVar44._24_4_ = fVar218 * fVar165;
            auVar44._28_4_ = auVar146._28_4_;
            auVar26 = vsubps_avx(auVar44,auVar43);
            auVar45._4_4_ = fVar155 * fVar173;
            auVar45._0_4_ = fVar150 * fVar168;
            auVar45._8_4_ = fVar157 * fVar175;
            auVar45._12_4_ = fVar159 * fVar177;
            auVar45._16_4_ = fVar161 * fVar179;
            auVar45._20_4_ = fVar163 * fVar181;
            auVar45._24_4_ = fVar165 * fVar183;
            auVar45._28_4_ = 0x34000000;
            auVar46._4_4_ = fVar199 * fVar156;
            auVar46._0_4_ = fVar196 * fVar154;
            auVar46._8_4_ = fVar200 * fVar158;
            auVar46._12_4_ = fVar201 * fVar160;
            auVar46._16_4_ = fVar202 * fVar162;
            auVar46._20_4_ = fVar203 * fVar164;
            auVar46._24_4_ = fVar204 * fVar184;
            auVar46._28_4_ = auVar139._28_4_;
            auVar139 = vsubps_avx(auVar46,auVar45);
            auVar140._8_4_ = 0x7fffffff;
            auVar140._0_8_ = 0x7fffffff7fffffff;
            auVar140._12_4_ = 0x7fffffff;
            auVar140._16_4_ = 0x7fffffff;
            auVar140._20_4_ = 0x7fffffff;
            auVar140._24_4_ = 0x7fffffff;
            auVar140._28_4_ = 0x7fffffff;
            auVar146 = vandps_avx(auVar43,auVar140);
            auVar73 = vandps_avx(auVar45,auVar140);
            auVar146 = vcmpps_avx(auVar146,auVar73,1);
            local_10c0 = vblendvps_avx(auVar139,auVar26,auVar146);
            auVar47._4_4_ = fVar209 * fVar156;
            auVar47._0_4_ = fVar206 * fVar154;
            auVar47._8_4_ = fVar211 * fVar158;
            auVar47._12_4_ = fVar213 * fVar160;
            auVar47._16_4_ = fVar215 * fVar162;
            auVar47._20_4_ = fVar217 * fVar164;
            auVar47._24_4_ = fVar219 * fVar184;
            auVar47._28_4_ = auVar116._28_4_;
            auVar48._4_4_ = fVar209 * fVar130;
            auVar48._0_4_ = fVar206 * fVar124;
            auVar48._8_4_ = fVar211 * fVar131;
            auVar48._12_4_ = fVar213 * fVar132;
            auVar48._16_4_ = fVar215 * fVar133;
            auVar48._20_4_ = fVar217 * fVar134;
            auVar48._24_4_ = fVar219 * fVar135;
            auVar48._28_4_ = auVar146._28_4_;
            auVar49._4_4_ = fVar172 * fVar155;
            auVar49._0_4_ = fVar166 * fVar150;
            auVar49._8_4_ = fVar174 * fVar157;
            auVar49._12_4_ = fVar176 * fVar159;
            auVar49._16_4_ = fVar178 * fVar161;
            auVar49._20_4_ = fVar180 * fVar163;
            auVar49._24_4_ = fVar182 * fVar165;
            auVar49._28_4_ = auVar26._28_4_;
            auVar139 = vsubps_avx(auVar48,auVar49);
            auVar50._4_4_ = fVar155 * fVar78;
            auVar50._0_4_ = fVar150 * fVar167;
            auVar50._8_4_ = fVar157 * fVar80;
            auVar50._12_4_ = fVar159 * fVar81;
            auVar50._16_4_ = fVar161 * fVar82;
            auVar50._20_4_ = fVar163 * fVar83;
            auVar50._24_4_ = fVar165 * fVar149;
            auVar50._28_4_ = auVar73._28_4_;
            auVar116 = vsubps_avx(auVar50,auVar47);
            auVar146 = vandps_avx(auVar49,auVar140);
            auVar73 = vandps_avx(auVar47,auVar140);
            auVar73 = vcmpps_avx(auVar146,auVar73,1);
            local_10a0 = vblendvps_avx(auVar116,auVar139,auVar73);
            auVar51._4_4_ = fVar199 * fVar78;
            auVar51._0_4_ = fVar196 * fVar167;
            auVar51._8_4_ = fVar200 * fVar80;
            auVar51._12_4_ = fVar201 * fVar81;
            auVar51._16_4_ = fVar202 * fVar82;
            auVar51._20_4_ = fVar203 * fVar83;
            auVar51._24_4_ = fVar204 * fVar149;
            auVar51._28_4_ = auVar23._28_4_;
            auVar52._4_4_ = fVar172 * fVar199;
            auVar52._0_4_ = fVar166 * fVar196;
            auVar52._8_4_ = fVar174 * fVar200;
            auVar52._12_4_ = fVar176 * fVar201;
            auVar52._16_4_ = fVar178 * fVar202;
            auVar52._20_4_ = fVar180 * fVar203;
            auVar52._24_4_ = fVar182 * fVar204;
            auVar52._28_4_ = auVar73._28_4_;
            auVar53._4_4_ = fVar208 * fVar209;
            auVar53._0_4_ = fVar205 * fVar206;
            auVar53._8_4_ = fVar210 * fVar211;
            auVar53._12_4_ = fVar212 * fVar213;
            auVar53._16_4_ = fVar214 * fVar215;
            auVar53._20_4_ = fVar216 * fVar217;
            auVar53._24_4_ = fVar218 * fVar219;
            auVar53._28_4_ = auVar139._28_4_;
            auVar54._4_4_ = fVar209 * fVar173;
            auVar54._0_4_ = fVar206 * fVar168;
            auVar54._8_4_ = fVar211 * fVar175;
            auVar54._12_4_ = fVar213 * fVar177;
            auVar54._16_4_ = fVar215 * fVar179;
            auVar54._20_4_ = fVar217 * fVar181;
            auVar54._24_4_ = fVar219 * fVar183;
            auVar54._28_4_ = auVar146._28_4_;
            auVar139 = vsubps_avx(auVar52,auVar53);
            auVar116 = vsubps_avx(auVar54,auVar51);
            auVar146 = vandps_avx(auVar53,auVar140);
            auVar73 = vandps_avx(auVar51,auVar140);
            auVar73 = vcmpps_avx(auVar146,auVar73,1);
            local_1080 = vblendvps_avx(auVar116,auVar139,auVar73);
            fVar167 = local_10c0._0_4_ * (float)local_1360._4_4_ +
                      local_10a0._0_4_ * (float)local_1400._4_4_ + local_1080._0_4_ * fVar72;
            fVar78 = local_10c0._4_4_ * (float)local_1360._4_4_ +
                     local_10a0._4_4_ * (float)local_1400._4_4_ + local_1080._4_4_ * fVar72;
            fVar79 = local_10c0._8_4_ * (float)local_1360._4_4_ +
                     local_10a0._8_4_ * (float)local_1400._4_4_ + local_1080._8_4_ * fVar72;
            fVar80 = local_10c0._12_4_ * (float)local_1360._4_4_ +
                     local_10a0._12_4_ * (float)local_1400._4_4_ + local_1080._12_4_ * fVar72;
            fVar81 = local_10c0._16_4_ * (float)local_1360._4_4_ +
                     local_10a0._16_4_ * (float)local_1400._4_4_ + local_1080._16_4_ * fVar72;
            fVar82 = local_10c0._20_4_ * (float)local_1360._4_4_ +
                     local_10a0._20_4_ * (float)local_1400._4_4_ + local_1080._20_4_ * fVar72;
            fVar72 = local_10c0._24_4_ * (float)local_1360._4_4_ +
                     local_10a0._24_4_ * (float)local_1400._4_4_ + local_1080._24_4_ * fVar72;
            fVar83 = auVar146._28_4_ + auVar146._28_4_ + auVar139._28_4_;
            auVar85._0_4_ = fVar167 + fVar167;
            auVar85._4_4_ = fVar78 + fVar78;
            auVar85._8_4_ = fVar79 + fVar79;
            auVar85._12_4_ = fVar80 + fVar80;
            auVar85._16_4_ = fVar81 + fVar81;
            auVar85._20_4_ = fVar82 + fVar82;
            auVar85._24_4_ = fVar72 + fVar72;
            auVar85._28_4_ = fVar83 + fVar83;
            auVar146 = vrcpps_avx(auVar85);
            fVar167 = local_10c0._0_4_ * fVar9 + local_10a0._0_4_ * fVar7 + local_1080._0_4_ * fVar8
            ;
            fVar78 = local_10c0._4_4_ * fVar12 +
                     local_10a0._4_4_ * fVar10 + local_1080._4_4_ * fVar11;
            fVar96 = local_10c0._8_4_ * fVar98 +
                     local_10a0._8_4_ * fVar96 + local_1080._8_4_ * fVar97;
            fVar97 = local_10c0._12_4_ * fVar13 +
                     local_10a0._12_4_ * fVar99 + local_1080._12_4_ * fVar101;
            fVar98 = local_10c0._16_4_ * fVar16 +
                     local_10a0._16_4_ * fVar14 + local_1080._16_4_ * fVar15;
            fVar99 = local_10c0._20_4_ * fVar19 +
                     local_10a0._20_4_ * fVar17 + local_1080._20_4_ * fVar18;
            fVar101 = local_10c0._24_4_ * fVar22 +
                      local_10a0._24_4_ * fVar20 + local_1080._24_4_ * fVar21;
            fVar72 = auVar146._0_4_;
            fVar7 = auVar146._4_4_;
            auVar55._4_4_ = auVar85._4_4_ * fVar7;
            auVar55._0_4_ = auVar85._0_4_ * fVar72;
            fVar8 = auVar146._8_4_;
            auVar55._8_4_ = auVar85._8_4_ * fVar8;
            fVar9 = auVar146._12_4_;
            auVar55._12_4_ = auVar85._12_4_ * fVar9;
            fVar10 = auVar146._16_4_;
            auVar55._16_4_ = auVar85._16_4_ * fVar10;
            fVar11 = auVar146._20_4_;
            auVar55._20_4_ = auVar85._20_4_ * fVar11;
            fVar12 = auVar146._24_4_;
            auVar55._24_4_ = auVar85._24_4_ * fVar12;
            auVar55._28_4_ = auVar116._28_4_;
            auVar129._8_4_ = 0x3f800000;
            auVar129._0_8_ = 0x3f8000003f800000;
            auVar129._12_4_ = 0x3f800000;
            auVar129._16_4_ = 0x3f800000;
            auVar129._20_4_ = 0x3f800000;
            auVar129._24_4_ = 0x3f800000;
            auVar129._28_4_ = 0x3f800000;
            auVar146 = vsubps_avx(auVar129,auVar55);
            uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar119._4_4_ = uVar1;
            auVar119._0_4_ = uVar1;
            auVar119._8_4_ = uVar1;
            auVar119._12_4_ = uVar1;
            auVar119._16_4_ = uVar1;
            auVar119._20_4_ = uVar1;
            auVar119._24_4_ = uVar1;
            auVar119._28_4_ = uVar1;
            local_10e0._4_4_ = (fVar78 + fVar78) * (fVar7 + fVar7 * auVar146._4_4_);
            local_10e0._0_4_ = (fVar167 + fVar167) * (fVar72 + fVar72 * auVar146._0_4_);
            local_10e0._8_4_ = (fVar96 + fVar96) * (fVar8 + fVar8 * auVar146._8_4_);
            local_10e0._12_4_ = (fVar97 + fVar97) * (fVar9 + fVar9 * auVar146._12_4_);
            local_10e0._16_4_ = (fVar98 + fVar98) * (fVar10 + fVar10 * auVar146._16_4_);
            local_10e0._20_4_ = (fVar99 + fVar99) * (fVar11 + fVar11 * auVar146._20_4_);
            local_10e0._24_4_ = (fVar101 + fVar101) * (fVar12 + fVar12 * auVar146._24_4_);
            local_10e0._28_4_ = local_1180._28_4_;
            auVar146 = vcmpps_avx(auVar119,local_10e0,2);
            fVar72 = (ray->super_RayK<1>).tfar;
            auVar106._4_4_ = fVar72;
            auVar106._0_4_ = fVar72;
            auVar106._8_4_ = fVar72;
            auVar106._12_4_ = fVar72;
            auVar106._16_4_ = fVar72;
            auVar106._20_4_ = fVar72;
            auVar106._24_4_ = fVar72;
            auVar106._28_4_ = fVar72;
            auVar73 = vcmpps_avx(local_10e0,auVar106,2);
            auVar146 = vandps_avx(auVar146,auVar73);
            auVar73 = vcmpps_avx(auVar85,_DAT_01faff00,4);
            auVar146 = vandps_avx(auVar73,auVar146);
            auVar93 = vpslld_avx(auVar146._0_16_,0x1f);
            auVar94 = vpsrad_avx(auVar93,0x1f);
            auVar93 = vpslld_avx(auVar146._16_16_,0x1f);
            auVar93 = vpsrad_avx(auVar93,0x1f);
            auVar86._16_16_ = auVar93;
            auVar86._0_16_ = auVar94;
            auVar59._8_8_ = uStack_11d8;
            auVar59._0_8_ = local_11e0;
            auVar59._16_8_ = uStack_11d0;
            auVar59._24_8_ = uStack_11c8;
            auVar146 = vandps_avx(local_1040,auVar59);
            auVar73 = auVar146 & auVar86;
            if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar73 >> 0x7f,0) != '\0') ||
                  (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0xbf,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar73[0x1f] < '\0') {
              uVar64 = *(uint *)(local_1468 + 0x18);
              uVar70 = CONCAT44(0,uVar64);
              local_137c = *(uint *)(local_1468 + 0x1c);
              auVar146 = vandps_avx(auVar86,auVar146);
              uVar60 = vextractps_avx(SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0),1)
              ;
              local_11c0._8_4_ = local_13c0._8_4_;
              local_11c0._0_8_ = local_13c0._0_8_;
              fStack_11b4 = local_13c0._12_4_;
              fStack_11b0 = local_13c0._16_4_;
              fStack_11ac = local_13c0._20_4_;
              fStack_11a8 = local_13c0._24_4_;
              fStack_11a4 = local_13c0._28_4_;
              local_1160 = &local_1448;
              local_1140 = auVar146;
              pGVar71 = (context->scene->geometries).items[uVar70].ptr;
              if ((pGVar71->mask & uVar60) != 0) {
                local_12a0 = auVar146;
                auVar93 = *(undefined1 (*) [16])(*local_1448 + local_1440 * 4);
                auVar94 = auVar93;
                if (2 < local_1438) {
                  auVar94 = *(undefined1 (*) [16])(*local_1448 + local_1440 * 8);
                }
                auVar73 = vrcpps_avx(local_1180);
                fVar72 = auVar73._0_4_;
                fVar7 = auVar73._4_4_;
                auVar56._4_4_ = local_1180._4_4_ * fVar7;
                auVar56._0_4_ = local_1180._0_4_ * fVar72;
                fVar8 = auVar73._8_4_;
                auVar56._8_4_ = local_1180._8_4_ * fVar8;
                fVar9 = auVar73._12_4_;
                auVar56._12_4_ = local_1180._12_4_ * fVar9;
                fVar10 = auVar73._16_4_;
                auVar56._16_4_ = local_1180._16_4_ * fVar10;
                fVar11 = auVar73._20_4_;
                auVar56._20_4_ = local_1180._20_4_ * fVar11;
                fVar12 = auVar73._24_4_;
                auVar56._24_4_ = local_1180._24_4_ * fVar12;
                auVar56._28_4_ = local_13c0._28_4_;
                auVar120._8_4_ = 0x3f800000;
                auVar120._0_8_ = 0x3f8000003f800000;
                auVar120._12_4_ = 0x3f800000;
                auVar120._16_4_ = 0x3f800000;
                auVar120._20_4_ = 0x3f800000;
                auVar120._24_4_ = 0x3f800000;
                auVar120._28_4_ = 0x3f800000;
                auVar139 = vsubps_avx(auVar120,auVar56);
                auVar74._0_4_ = fVar72 + fVar72 * auVar139._0_4_;
                auVar74._4_4_ = fVar7 + fVar7 * auVar139._4_4_;
                auVar74._8_4_ = fVar8 + fVar8 * auVar139._8_4_;
                auVar74._12_4_ = fVar9 + fVar9 * auVar139._12_4_;
                auVar74._16_4_ = fVar10 + fVar10 * auVar139._16_4_;
                auVar74._20_4_ = fVar11 + fVar11 * auVar139._20_4_;
                auVar74._24_4_ = fVar12 + fVar12 * auVar139._24_4_;
                auVar74._28_4_ = auVar73._28_4_ + auVar139._28_4_;
                auVar87._8_4_ = 0x219392ef;
                auVar87._0_8_ = 0x219392ef219392ef;
                auVar87._12_4_ = 0x219392ef;
                auVar87._16_4_ = 0x219392ef;
                auVar87._20_4_ = 0x219392ef;
                auVar87._24_4_ = 0x219392ef;
                auVar87._28_4_ = 0x219392ef;
                auVar73 = vcmpps_avx(local_1060,auVar87,5);
                auVar73 = vandps_avx(auVar73,auVar74);
                auVar57._4_4_ = auVar73._4_4_ * fVar189;
                auVar57._0_4_ = auVar73._0_4_ * fVar185;
                auVar57._8_4_ = auVar73._8_4_ * local_13c0._8_4_;
                auVar57._12_4_ = auVar73._12_4_ * local_13c0._12_4_;
                auVar57._16_4_ = auVar73._16_4_ * local_13c0._16_4_;
                auVar57._20_4_ = auVar73._20_4_ * local_13c0._20_4_;
                auVar57._24_4_ = auVar73._24_4_ * local_13c0._24_4_;
                auVar57._28_4_ = auVar74._28_4_;
                auVar139 = vminps_avx(auVar57,auVar120);
                auVar58._4_4_ = local_11a0._4_4_ * auVar73._4_4_;
                auVar58._0_4_ = local_11a0._0_4_ * auVar73._0_4_;
                auVar58._8_4_ = local_11a0._8_4_ * auVar73._8_4_;
                auVar58._12_4_ = local_11a0._12_4_ * auVar73._12_4_;
                auVar58._16_4_ = local_11a0._16_4_ * auVar73._16_4_;
                auVar58._20_4_ = local_11a0._20_4_ * auVar73._20_4_;
                auVar58._24_4_ = local_11a0._24_4_ * auVar73._24_4_;
                auVar58._28_4_ = auVar73._28_4_;
                auVar73 = vminps_avx(auVar58,auVar120);
                auVar145 = *local_1448;
                if (local_1440 == 2) {
                  auVar145 = vpshufd_avx(auVar145,0x54);
                  auVar93 = vpshufd_avx(auVar93,0x54);
                  auVar94 = vpshufd_avx(auVar94,0x54);
                }
                auVar121._16_16_ = auVar93;
                auVar121._0_16_ = auVar145;
                auVar141._16_16_ = auVar94;
                auVar141._0_16_ = auVar93;
                auVar28 = vunpcklps_avx(auVar121,auVar141);
                auVar145 = vpshufd_avx(auVar145,0xa5);
                auVar89 = vpshufd_avx(auVar93,0xa5);
                auVar137._0_16_ = vpsrld_avx(auVar28._0_16_,0x10);
                auVar151 = vpsrld_avx(auVar28._16_16_,0x10);
                auVar137._16_16_ = auVar151;
                auVar152._16_16_ = auVar89;
                auVar152._0_16_ = auVar145;
                auVar93 = vpshufd_avx(auVar93,0x94);
                auVar94 = vpshufd_avx(auVar94,0x94);
                auVar142._0_16_ = vpsrld_avx(auVar145,0x10);
                auVar145 = vpsrld_avx(auVar89,0x10);
                auVar142._16_16_ = auVar145;
                auVar147._16_16_ = auVar94;
                auVar147._0_16_ = auVar93;
                auVar107._0_16_ = vpsrld_avx(auVar93,0x10);
                auVar93 = vpsrld_avx(auVar94,0x10);
                auVar107._16_16_ = auVar93;
                auVar170._8_4_ = 0xffff;
                auVar170._0_8_ = 0xffff0000ffff;
                auVar170._12_4_ = 0xffff;
                auVar170._16_4_ = 0xffff;
                auVar170._20_4_ = 0xffff;
                auVar170._24_4_ = 0xffff;
                auVar170._28_4_ = 0xffff;
                auVar116 = vandps_avx(auVar152,auVar170);
                auVar26 = vcvtdq2ps_avx(auVar116);
                auVar116 = vandps_avx(auVar147,auVar170);
                auVar27 = vcvtdq2ps_avx(auVar116);
                auVar23 = vcvtdq2ps_avx(auVar142);
                auVar24 = vcvtdq2ps_avx(auVar107);
                auVar143._8_4_ = 0x3f800000;
                auVar143._0_8_ = 0x3f8000003f800000;
                auVar143._12_4_ = 0x3f800000;
                auVar143._16_4_ = 0x3f800000;
                auVar143._20_4_ = 0x3f800000;
                auVar143._24_4_ = 0x3f800000;
                auVar143._28_4_ = 0x3f800000;
                auVar116 = vsubps_avx(auVar143,auVar139);
                auVar25 = vsubps_avx(auVar116,auVar73);
                auVar116 = vandps_avx(auVar170,auVar28);
                auVar116 = vcvtdq2ps_avx(auVar116);
                auVar28 = vcvtdq2ps_avx(auVar137);
                local_1120[0] =
                     auVar27._0_4_ * 0.00012207031 * auVar73._0_4_ +
                     auVar139._0_4_ * auVar26._0_4_ * 0.00012207031 +
                     auVar25._0_4_ * auVar116._0_4_ * 0.00012207031;
                local_1120[1] =
                     auVar27._4_4_ * 0.00012207031 * auVar73._4_4_ +
                     auVar139._4_4_ * auVar26._4_4_ * 0.00012207031 +
                     auVar25._4_4_ * auVar116._4_4_ * 0.00012207031;
                local_1120[2] =
                     auVar27._8_4_ * 0.00012207031 * auVar73._8_4_ +
                     auVar139._8_4_ * auVar26._8_4_ * 0.00012207031 +
                     auVar25._8_4_ * auVar116._8_4_ * 0.00012207031;
                local_1120[3] =
                     auVar27._12_4_ * 0.00012207031 * auVar73._12_4_ +
                     auVar139._12_4_ * auVar26._12_4_ * 0.00012207031 +
                     auVar25._12_4_ * auVar116._12_4_ * 0.00012207031;
                fStack_1110 = auVar27._16_4_ * 0.00012207031 * auVar73._16_4_ +
                              auVar139._16_4_ * auVar26._16_4_ * 0.00012207031 +
                              auVar25._16_4_ * auVar116._16_4_ * 0.00012207031;
                fStack_110c = auVar27._20_4_ * 0.00012207031 * auVar73._20_4_ +
                              auVar139._20_4_ * auVar26._20_4_ * 0.00012207031 +
                              auVar25._20_4_ * auVar116._20_4_ * 0.00012207031;
                fStack_1108 = auVar27._24_4_ * 0.00012207031 * auVar73._24_4_ +
                              auVar139._24_4_ * auVar26._24_4_ * 0.00012207031 +
                              auVar25._24_4_ * auVar116._24_4_ * 0.00012207031;
                fStack_1104 = auVar27._28_4_ + auVar26._28_4_ + auVar116._28_4_;
                local_1100[0] =
                     auVar73._0_4_ * auVar24._0_4_ * 0.00012207031 +
                     auVar139._0_4_ * auVar23._0_4_ * 0.00012207031 +
                     auVar25._0_4_ * auVar28._0_4_ * 0.00012207031;
                local_1100[1] =
                     auVar73._4_4_ * auVar24._4_4_ * 0.00012207031 +
                     auVar139._4_4_ * auVar23._4_4_ * 0.00012207031 +
                     auVar25._4_4_ * auVar28._4_4_ * 0.00012207031;
                local_1100[2] =
                     auVar73._8_4_ * auVar24._8_4_ * 0.00012207031 +
                     auVar139._8_4_ * auVar23._8_4_ * 0.00012207031 +
                     auVar25._8_4_ * auVar28._8_4_ * 0.00012207031;
                local_1100[3] =
                     auVar73._12_4_ * auVar24._12_4_ * 0.00012207031 +
                     auVar139._12_4_ * auVar23._12_4_ * 0.00012207031 +
                     auVar25._12_4_ * auVar28._12_4_ * 0.00012207031;
                fStack_10f0 = auVar73._16_4_ * auVar24._16_4_ * 0.00012207031 +
                              auVar139._16_4_ * auVar23._16_4_ * 0.00012207031 +
                              auVar25._16_4_ * auVar28._16_4_ * 0.00012207031;
                fStack_10ec = auVar73._20_4_ * auVar24._20_4_ * 0.00012207031 +
                              auVar139._20_4_ * auVar23._20_4_ * 0.00012207031 +
                              auVar25._20_4_ * auVar28._20_4_ * 0.00012207031;
                fStack_10e8 = auVar73._24_4_ * auVar24._24_4_ * 0.00012207031 +
                              auVar139._24_4_ * auVar23._24_4_ * 0.00012207031 +
                              auVar25._24_4_ * auVar28._24_4_ * 0.00012207031;
                fStack_10e4 = auVar24._28_4_ + auVar23._28_4_ + auVar25._28_4_;
                auVar75._8_4_ = 0x7f800000;
                auVar75._0_8_ = 0x7f8000007f800000;
                auVar75._12_4_ = 0x7f800000;
                auVar75._16_4_ = 0x7f800000;
                auVar75._20_4_ = 0x7f800000;
                auVar75._24_4_ = 0x7f800000;
                auVar75._28_4_ = 0x7f800000;
                auVar73 = vblendvps_avx(auVar75,local_10e0,auVar146);
                auVar139 = vshufps_avx(auVar73,auVar73,0xb1);
                auVar139 = vminps_avx(auVar73,auVar139);
                auVar116 = vshufpd_avx(auVar139,auVar139,5);
                auVar139 = vminps_avx(auVar139,auVar116);
                auVar116 = vperm2f128_avx(auVar139,auVar139,1);
                auVar139 = vminps_avx(auVar139,auVar116);
                auVar73 = vcmpps_avx(auVar73,auVar139,0);
                auVar139 = auVar146 & auVar73;
                if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar139 >> 0x7f,0) != '\0') ||
                      (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar139 >> 0xbf,0) != '\0') ||
                    (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar139[0x1f] < '\0') {
                  auVar146 = vandps_avx(auVar73,auVar146);
                }
                uVar61 = vmovmskps_avx(auVar146);
                uVar60 = 0;
                if (uVar61 != 0) {
                  for (; (uVar61 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                  }
                }
                uVar63 = (ulong)uVar60;
                local_13e0._0_8_ = context->args;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  _local_1360 = local_10e0;
                  local_12c0._0_8_ = context->user;
                  _local_1400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_12e0._0_8_ = uVar70;
                  local_1300._0_4_ = local_137c;
                  local_1320._0_8_ = pGVar71;
                  do {
                    local_1384 = local_1120[uVar63];
                    local_1380 = local_1100[uVar63];
                    (ray->super_RayK<1>).tfar = *(float *)(local_10e0 + uVar63 * 4);
                    local_13c0._0_8_ = uVar63;
                    local_1390 = *(float *)(local_10c0 + uVar63 * 4);
                    local_138c = *(undefined4 *)(local_10a0 + uVar63 * 4);
                    local_1388 = *(undefined4 *)(local_1080 + uVar63 * 4);
                    local_1378 = (int)uVar70;
                    local_1374 = *(uint *)local_12c0._0_8_;
                    local_1370 = *(uint *)(local_12c0._0_8_ + 4);
                    local_1454 = -1;
                    local_1430.valid = &local_1454;
                    local_1430.geometryUserPtr = pGVar71->userPtr;
                    local_1430.context = (RTCRayQueryContext *)local_12c0._0_8_;
                    local_1430.ray = (RTCRayN *)ray;
                    local_1430.hit = (RTCHitN *)&local_1390;
                    local_1430.N = 1;
                    uVar64 = local_137c;
                    if (pGVar71->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011e71e3:
                      if ((*(code **)(local_13e0._0_8_ + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_13e0._0_8_ & 2) != 0 ||
                          (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                        (**(code **)(local_13e0._0_8_ + 0x10))(&local_1430);
                        ray = local_1450;
                        uVar70 = local_12e0._0_8_;
                        pGVar71 = (Geometry *)local_1320._0_8_;
                        uVar64 = local_1300._0_4_;
                        if (*local_1430.valid == 0) goto LAB_011e7298;
                      }
                      (((Vec3f *)((long)local_1430.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1430.hit;
                      (((Vec3f *)((long)local_1430.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1430.hit + 4);
                      (((Vec3f *)((long)local_1430.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1430.hit + 8);
                      *(float *)((long)local_1430.ray + 0x3c) = *(float *)(local_1430.hit + 0xc);
                      *(float *)((long)local_1430.ray + 0x40) = *(float *)(local_1430.hit + 0x10);
                      *(float *)((long)local_1430.ray + 0x44) = *(float *)(local_1430.hit + 0x14);
                      *(float *)((long)local_1430.ray + 0x48) = *(float *)(local_1430.hit + 0x18);
                      *(float *)((long)local_1430.ray + 0x4c) = *(float *)(local_1430.hit + 0x1c);
                      *(float *)((long)local_1430.ray + 0x50) = *(float *)(local_1430.hit + 0x20);
                      local_137c = uVar64;
                    }
                    else {
                      (*pGVar71->intersectionFilterN)(&local_1430);
                      ray = local_1450;
                      uVar70 = local_12e0._0_8_;
                      pGVar71 = (Geometry *)local_1320._0_8_;
                      uVar64 = local_1300._0_4_;
                      if (*local_1430.valid != 0) goto LAB_011e71e3;
LAB_011e7298:
                      (local_1450->super_RayK<1>).tfar = (float)local_1400._0_4_;
                      ray = local_1450;
                      uVar70 = local_12e0._0_8_;
                      pGVar71 = (Geometry *)local_1320._0_8_;
                      local_137c = local_1300._0_4_;
                    }
                    *(undefined4 *)(local_12a0 + local_13c0._0_8_ * 4) = 0;
                    auVar139 = local_12a0;
                    fVar72 = (ray->super_RayK<1>).tfar;
                    auVar76._4_4_ = fVar72;
                    auVar76._0_4_ = fVar72;
                    auVar76._8_4_ = fVar72;
                    auVar76._12_4_ = fVar72;
                    auVar76._16_4_ = fVar72;
                    auVar76._20_4_ = fVar72;
                    auVar76._24_4_ = fVar72;
                    auVar76._28_4_ = fVar72;
                    auVar73 = vcmpps_avx(_local_1360,auVar76,2);
                    auVar146 = vandps_avx(auVar73,local_12a0);
                    local_12a0 = auVar146;
                    auVar139 = auVar139 & auVar73;
                    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar139 >> 0x7f,0) == '\0') &&
                          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar139 >> 0xbf,0) == '\0') &&
                        (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar139[0x1f]) goto LAB_011e700c;
                    auVar88._8_4_ = 0x7f800000;
                    auVar88._0_8_ = 0x7f8000007f800000;
                    auVar88._12_4_ = 0x7f800000;
                    auVar88._16_4_ = 0x7f800000;
                    auVar88._20_4_ = 0x7f800000;
                    auVar88._24_4_ = 0x7f800000;
                    auVar88._28_4_ = 0x7f800000;
                    auVar73 = vblendvps_avx(auVar88,_local_1360,auVar146);
                    auVar139 = vshufps_avx(auVar73,auVar73,0xb1);
                    auVar139 = vminps_avx(auVar73,auVar139);
                    auVar116 = vshufpd_avx(auVar139,auVar139,5);
                    auVar139 = vminps_avx(auVar139,auVar116);
                    auVar116 = vperm2f128_avx(auVar139,auVar139,1);
                    auVar139 = vminps_avx(auVar139,auVar116);
                    auVar73 = vcmpps_avx(auVar73,auVar139,0);
                    auVar139 = auVar146 & auVar73;
                    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar139 >> 0x7f,0) != '\0') ||
                          (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar139 >> 0xbf,0) != '\0') ||
                        (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar139[0x1f] < '\0') {
                      auVar146 = vandps_avx(auVar73,auVar146);
                    }
                    _local_1400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar60 = vmovmskps_avx(auVar146);
                    uVar64 = 0;
                    if (uVar60 != 0) {
                      for (; (uVar60 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                      }
                    }
                    uVar63 = (ulong)uVar64;
                  } while( true );
                }
                fVar72 = local_1120[uVar63];
                fVar7 = local_1100[uVar63];
                fVar8 = *(float *)(local_10c0 + uVar63 * 4);
                fVar9 = *(float *)(local_10a0 + uVar63 * 4);
                fVar10 = *(float *)(local_1080 + uVar63 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_10e0 + uVar63 * 4);
                (ray->Ng).field_0.field_0.x = fVar8;
                (ray->Ng).field_0.field_0.y = fVar9;
                (ray->Ng).field_0.field_0.z = fVar10;
                ray->u = fVar72;
                ray->v = fVar7;
                ray->primID = local_137c;
                ray->geomID = uVar64;
                pRVar5 = context->user;
                ray->instID[0] = pRVar5->instID[0];
                ray->instPrimID[0] = pRVar5->instPrimID[0];
              }
            }
          }
LAB_011e700c:
          fVar72 = (ray->super_RayK<1>).tfar;
          auVar77 = ZEXT1664(CONCAT412(fVar72,CONCAT48(fVar72,CONCAT44(fVar72,fVar72))));
          auVar144 = ZEXT1664(local_11f0);
          auVar148 = ZEXT1664(local_1200);
          auVar153 = ZEXT1664(local_1210);
          auVar171 = ZEXT1664(local_1220);
          auVar187 = ZEXT1664(local_1230);
          auVar195 = ZEXT1664(local_1240);
          auVar198 = ZEXT1664(local_1250);
          auVar207 = ZEXT1664(local_1260);
          auVar220 = ZEXT1664(local_1270);
          auVar138 = ZEXT1664(local_1330);
        }
        else {
          local_1468 = uVar70 & 0xfffffffffffffff0;
          lVar6 = *(long *)(local_1468 + 0x30 + (ulong)*(uint *)(local_1468 + 0x2c));
          fVar72 = (ray->super_RayK<1>).tfar;
          auVar77 = ZEXT1664(CONCAT412(fVar72,CONCAT48(fVar72,CONCAT44(fVar72,fVar72))));
          if (lVar6 != 0) {
            *(long *)*pauVar62 = lVar6;
            *(undefined4 *)(*pauVar62 + 8) = 0;
            pauVar62 = pauVar62 + 1;
          }
        }
      }
    } while (pauVar62 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }